

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.cc
# Opt level: O0

void __thiscall OperandValue::saveXml(OperandValue *this,ostream *s)

{
  uintm uVar1;
  ostream *poVar2;
  void *pvVar3;
  SubtableSymbol *this_00;
  ostream *s_local;
  OperandValue *this_local;
  
  std::operator<<(s,"<operand_exp");
  poVar2 = std::operator<<(s," index=\"");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
  poVar2 = (ostream *)std::ostream::operator<<(pvVar3,this->index);
  std::operator<<(poVar2,"\"");
  poVar2 = std::operator<<(s," table=\"0x");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::hex);
  this_00 = Constructor::getParent(this->ct);
  uVar1 = SleighSymbol::getId((SleighSymbol *)this_00);
  poVar2 = (ostream *)std::ostream::operator<<(pvVar3,uVar1);
  std::operator<<(poVar2,"\"");
  poVar2 = std::operator<<(s," ct=\"0x");
  uVar1 = Constructor::getId(this->ct);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
  std::operator<<(poVar2,"\"/>\n");
  return;
}

Assistant:

void OperandValue::saveXml(ostream &s) const

{
  s << "<operand_exp";
  s << " index=\"" << dec << index << "\"";
  s << " table=\"0x" << hex << ct->getParent()->getId() << "\"";
  s << " ct=\"0x" << ct->getId() << "\"/>\n"; // Save id of our constructor
}